

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleIni.h
# Opt level: O1

int __thiscall
CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::GetSectionSize
          (CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *this,char *a_pSection)

{
  bool bVar1;
  const_iterator cVar2;
  _Base_ptr p_Var3;
  _Rb_tree_color _Var4;
  char *pLeft;
  key_type local_40;
  
  _Var4 = ~_S_red;
  if (a_pSection != (char *)0x0) {
    local_40.pComment = (char *)0x0;
    local_40.nOrder = 0;
    local_40.pItem = a_pSection;
    cVar2 = std::
            _Rb_tree<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>_>,_std::_Select1st<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>_>_>,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>_>_>_>
            ::find(&(this->m_data)._M_t,&local_40);
    if ((_Rb_tree_header *)cVar2._M_node != &(this->m_data)._M_t._M_impl.super__Rb_tree_header) {
      if ((this->m_bAllowMultiKey == true) && (*(long *)(cVar2._M_node + 3) != 0)) {
        p_Var3 = cVar2._M_node[2]._M_left;
        if (p_Var3 == cVar2._M_node + 2) {
          _Var4 = _S_red;
        }
        else {
          pLeft = (char *)0x0;
          _Var4 = _S_red;
          do {
            if ((pLeft == (char *)0x0) ||
               (bVar1 = SI_GenericNoCase<char>::operator()
                                  ((SI_GenericNoCase<char> *)
                                   &CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::
                                    IsLess(char_const*,char_const*)::isLess,pLeft,
                                   *(char **)(p_Var3 + 1)), bVar1)) {
              _Var4 = _Var4 + _S_black;
              pLeft = *(char **)(p_Var3 + 1);
            }
            p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
          } while (p_Var3 != cVar2._M_node + 2);
        }
      }
      else {
        _Var4 = cVar2._M_node[3]._M_color;
      }
    }
  }
  return _Var4;
}

Assistant:

int CSimpleIniTempl<SI_CHAR, SI_STRLESS, SI_CONVERTER>::GetSectionSize(const SI_CHAR *a_pSection) const {
	if (!a_pSection) {
		return -1;
	}

	typename TSection::const_iterator iSection = m_data.find(a_pSection);
	if (iSection == m_data.end()) {
		return -1;
	}
	const TKeyVal &section = iSection->second;

	// if multi-key isn't permitted then the section size is
	// the number of keys that we have.
	if (!m_bAllowMultiKey || section.empty()) {
		return (int)section.size();
	}

	// otherwise we need to count them
	int nCount = 0;
	const SI_CHAR *pLastKey = NULL;
	typename TKeyVal::const_iterator iKeyVal = section.begin();
	for (int n = 0; iKeyVal != section.end(); ++iKeyVal, ++n) {
		if (!pLastKey || IsLess(pLastKey, iKeyVal->first.pItem)) {
			++nCount;
			pLastKey = iKeyVal->first.pItem;
		}
	}
	return nCount;
}